

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

void y_convolve_2tap_16x2_avx2
               (uint8_t *src,ptrdiff_t stride,__m256i *coeffs,__m128i *s_128,__m256i *r)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 (*in_RCX) [32];
  long in_RSI;
  long in_RDI;
  undefined1 (*in_R8) [32];
  undefined1 auVar5 [32];
  __m256i ss1;
  __m256i ss0;
  __m256i s_256 [2];
  __m256i *coeffs_00;
  __m256i *ss;
  
  uVar2 = ((undefined8 *)(in_RDI + in_RSI))[1];
  *(undefined8 *)(*in_RCX + 0x10) = *(undefined8 *)(in_RDI + in_RSI);
  *(undefined8 *)(*in_RCX + 0x18) = uVar2;
  auVar4 = *in_RCX;
  auVar3 = *in_RCX;
  puVar1 = (undefined8 *)(in_RDI + in_RSI * 2);
  uVar2 = puVar1[1];
  *(undefined8 *)*in_RCX = *puVar1;
  *(undefined8 *)(*in_RCX + 8) = uVar2;
  auVar5._16_8_ = *(undefined8 *)*in_RCX;
  auVar5._0_16_ = *(undefined1 (*) [16])(*in_RCX + 0x10);
  auVar5._24_8_ = *(undefined8 *)(*in_RCX + 8);
  vpunpcklbw_avx2(auVar3,auVar5);
  auVar3._16_8_ = *(undefined8 *)*in_RCX;
  auVar3._0_16_ = *(undefined1 (*) [16])(*in_RCX + 0x10);
  auVar3._24_8_ = *(undefined8 *)(*in_RCX + 8);
  auVar5 = vpunpckhbw_avx2(auVar4,auVar3);
  ss = auVar5._16_8_;
  coeffs_00 = auVar5._8_8_;
  convolve_2tap_avx2(ss,coeffs_00);
  *in_R8 = auVar5;
  convolve_2tap_avx2(ss,coeffs_00);
  in_R8[1] = auVar5;
  return;
}

Assistant:

static inline void y_convolve_2tap_16x2_avx2(const uint8_t *const src,
                                             const ptrdiff_t stride,
                                             const __m256i coeffs[1],
                                             __m128i s_128[2], __m256i r[2]) {
  __m256i s_256[2];

  s_128[1] = _mm_loadu_si128((__m128i *)(src + stride));
  s_256[0] = _mm256_setr_m128i(s_128[0], s_128[1]);
  s_128[0] = _mm_loadu_si128((__m128i *)(src + 2 * stride));
  s_256[1] = _mm256_setr_m128i(s_128[1], s_128[0]);
  const __m256i ss0 = _mm256_unpacklo_epi8(s_256[0], s_256[1]);
  const __m256i ss1 = _mm256_unpackhi_epi8(s_256[0], s_256[1]);
  r[0] = convolve_2tap_avx2(&ss0, coeffs);
  r[1] = convolve_2tap_avx2(&ss1, coeffs);
}